

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

void __thiscall
despot::option::PrintUsageImplementation::LinePartIterator::update_length(LinePartIterator *this)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  
  this->screenlen = 0;
  iVar7 = 0;
  while( true ) {
    this->len = iVar7;
    pcVar2 = this->ptr;
    if (((byte)pcVar2[iVar7] < 0xc) && ((0xe01U >> ((byte)pcVar2[iVar7] & 0x1f) & 1) != 0)) break;
    this->screenlen = this->screenlen + 1;
    bVar1 = pcVar2[iVar7];
    if ((0xc1 < bVar1) &&
       (uVar5 = (uint)(byte)pcVar2[(long)iVar7 + 1], (byte)(pcVar2[(long)iVar7 + 1] ^ 0x80U) < 0x40)
       ) {
      uVar6 = bVar1 ^ 0xff;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar6 = ((uint)bVar1 << (~(byte)iVar3 & 0x1f)) >> (~(byte)iVar3 & 0x1f);
      pbVar8 = (byte *)(pcVar2 + (long)iVar7 + 2);
      do {
        iVar7 = iVar7 + 1;
        uVar9 = uVar6 << 6;
        uVar6 = uVar5 ^ uVar9 ^ 0x80;
        this->len = iVar7;
        uVar5 = (uint)*pbVar8;
        pbVar8 = pbVar8 + 1;
      } while ((uVar5 ^ 0x80) < 0x40);
      if (0x10ff < uVar9) {
        bVar4 = isWideChar(uVar6);
        if (bVar4) {
          this->screenlen = this->screenlen + 1;
        }
      }
    }
    iVar7 = this->len + 1;
  }
  return;
}

Assistant:

void update_length() {
			screenlen = 0;
			for (len = 0;
				ptr[len] != 0 && ptr[len] != '\v' && ptr[len] != '\t'
					&& ptr[len] != '\n'; ++len) {
				++screenlen;
				unsigned ch = (unsigned char) ptr[len];
				if (ch > 0xC1) // everything <= 0xC1 (yes, even 0xC1 itself) is not a valid UTF-8 start byte
					{
					// int __builtin_clz (unsigned int x)
					// Returns the number of leading 0-bits in x, starting at the most significant bit
					unsigned mask = (unsigned) -1 >> __builtin_clz(ch ^ 0xff);
					ch = ch & mask; // mask out length bits, we don't verify their correctness
					while (((unsigned char) ptr[len + 1] ^ 0x80) <= 0x3F) // while next byte is continuation byte
					{
						ch = (ch << 6) ^ (unsigned char) ptr[len + 1] ^ 0x80; // add continuation to char code
						++len;
					}
					// ch is the decoded unicode code point
					if (ch >= 0x1100 && isWideChar(ch)) // the test for 0x1100 is here to avoid the function call in the Latin case
						++screenlen;
				}
			}
		}